

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_ghost_glob(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_GLOB *data)

{
  uint uVar1;
  REF_GLOB local_c8;
  REF_GLOB local_c0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT request;
  REF_INT node1;
  REF_INT node0;
  REF_GLOB *b_data;
  REF_GLOB *a_data;
  REF_GLOB *b_nodes;
  REF_GLOB *a_nodes;
  REF_INT *a_edge;
  REF_INT *a_next;
  REF_INT part;
  REF_INT edge;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_NODE ref_node;
  REF_GLOB *data_local;
  REF_MPI ref_mpi_local;
  REF_EDGE ref_edge_local;
  
  a_size = &ref_edge->node->n;
  if (ref_mpi->n < 2) {
    ref_edge_local._4_4_ = 0;
  }
  else {
    ref_node = (REF_NODE)data;
    data_local = (REF_GLOB *)ref_mpi;
    ref_mpi_local = (REF_MPI)ref_edge;
    if (ref_mpi->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x113,
             "ref_edge_ghost_glob","malloc a_size of REF_INT negative");
      ref_edge_local._4_4_ = 1;
    }
    else {
      b_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
      if (b_size == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x113,"ref_edge_ghost_glob","malloc a_size of REF_INT NULL");
        ref_edge_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < (int)*data_local;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          b_size[ref_private_macro_code_rss] = 0;
        }
        if ((int)*data_local < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x114,"ref_edge_ghost_glob","malloc b_size of REF_INT negative");
          ref_edge_local._4_4_ = 1;
        }
        else {
          _b_total = (REF_INT *)malloc((long)(int)*data_local << 2);
          if (_b_total == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   0x114,"ref_edge_ghost_glob","malloc b_size of REF_INT NULL");
            ref_edge_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < (int)*data_local;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              _b_total[ref_private_macro_code_rss_1] = 0;
            }
            for (a_next._4_4_ = 0; a_next._4_4_ < ref_mpi_local->n; a_next._4_4_ = a_next._4_4_ + 1)
            {
              uVar1 = ref_edge_part((REF_EDGE)ref_mpi_local,a_next._4_4_,(REF_INT *)&a_next);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x117,"ref_edge_ghost_glob",(ulong)uVar1,"edge part");
                return uVar1;
              }
              if ((int)a_next != *(int *)((long)data_local + 4)) {
                b_size[(int)a_next] = b_size[(int)a_next] + 1;
              }
            }
            uVar1 = ref_mpi_alltoall((REF_MPI)data_local,b_size,_b_total,1);
            if (uVar1 == 0) {
              edge = 0;
              for (a_next._0_4_ = 0; (int)a_next < (int)*data_local; a_next._0_4_ = (int)a_next + 1)
              {
                edge = b_size[(int)a_next] + edge;
              }
              if (edge * 2 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x120,"ref_edge_ghost_glob","malloc a_nodes of REF_GLOB negative");
                ref_edge_local._4_4_ = 1;
              }
              else {
                b_nodes = (REF_GLOB *)malloc((long)(edge << 1) << 3);
                if (b_nodes == (REF_GLOB *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x120,"ref_edge_ghost_glob","malloc a_nodes of REF_GLOB NULL");
                  ref_edge_local._4_4_ = 2;
                }
                else if (edge < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x121,"ref_edge_ghost_glob","malloc a_data of REF_GLOB negative");
                  ref_edge_local._4_4_ = 1;
                }
                else {
                  b_data = (REF_GLOB *)malloc((long)edge << 3);
                  if (b_data == (REF_GLOB *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x121,"ref_edge_ghost_glob","malloc a_data of REF_GLOB NULL");
                    ref_edge_local._4_4_ = 2;
                  }
                  else if (edge < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x122,"ref_edge_ghost_glob","malloc a_edge of REF_INT negative");
                    ref_edge_local._4_4_ = 1;
                  }
                  else {
                    a_nodes = (REF_GLOB *)malloc((long)edge << 2);
                    if (a_nodes == (REF_GLOB *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                             ,0x122,"ref_edge_ghost_glob","malloc a_edge of REF_INT NULL");
                      ref_edge_local._4_4_ = 2;
                    }
                    else {
                      part = 0;
                      for (a_next._0_4_ = 0; (int)a_next < (int)*data_local;
                          a_next._0_4_ = (int)a_next + 1) {
                        part = _b_total[(int)a_next] + part;
                      }
                      if (part * 2 < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                               ,0x126,"ref_edge_ghost_glob","malloc b_nodes of REF_GLOB negative");
                        ref_edge_local._4_4_ = 1;
                      }
                      else {
                        a_data = (REF_GLOB *)malloc((long)(part << 1) << 3);
                        if (a_data == (REF_GLOB *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                 ,0x126,"ref_edge_ghost_glob","malloc b_nodes of REF_GLOB NULL");
                          ref_edge_local._4_4_ = 2;
                        }
                        else if (part < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                 ,0x127,"ref_edge_ghost_glob","malloc b_data of REF_GLOB negative");
                          ref_edge_local._4_4_ = 1;
                        }
                        else {
                          _node1 = malloc((long)part << 3);
                          if (_node1 == (void *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                   ,0x127,"ref_edge_ghost_glob","malloc b_data of REF_GLOB NULL");
                            ref_edge_local._4_4_ = 2;
                          }
                          else if ((int)*data_local < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                   ,0x129,"ref_edge_ghost_glob","malloc a_next of REF_INT negative")
                            ;
                            ref_edge_local._4_4_ = 1;
                          }
                          else {
                            a_edge = (REF_INT *)malloc((long)(int)*data_local << 2);
                            if (a_edge == (REF_INT *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                     ,0x129,"ref_edge_ghost_glob","malloc a_next of REF_INT NULL");
                              ref_edge_local._4_4_ = 2;
                            }
                            else {
                              *a_edge = 0;
                              for (a_next._0_4_ = 1; (int)a_next < (int)*data_local;
                                  a_next._0_4_ = (int)a_next + 1) {
                                a_edge[(int)a_next] =
                                     a_edge[(int)a_next + -1] + b_size[(int)a_next + -1];
                              }
                              for (a_next._4_4_ = 0; a_next._4_4_ < ref_mpi_local->n;
                                  a_next._4_4_ = a_next._4_4_ + 1) {
                                uVar1 = ref_edge_part((REF_EDGE)ref_mpi_local,a_next._4_4_,
                                                      (REF_INT *)&a_next);
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                         ,0x12f,"ref_edge_ghost_glob",(ulong)uVar1,"edge part");
                                  return uVar1;
                                }
                                if ((int)a_next != *(int *)((long)data_local + 4)) {
                                  *(int *)((long)a_nodes + (long)a_edge[(int)a_next] * 4) =
                                       a_next._4_4_;
                                  if (((*(int *)(*(long *)&ref_mpi_local->max_tag +
                                                (long)(a_next._4_4_ << 1) * 4) < 0) ||
                                      (a_size[1] <=
                                       *(int *)(*(long *)&ref_mpi_local->max_tag +
                                               (long)(a_next._4_4_ << 1) * 4))) ||
                                     (*(long *)(*(long *)(a_size + 4) +
                                               (long)*(int *)(*(long *)&ref_mpi_local->max_tag +
                                                             (long)(a_next._4_4_ << 1) * 4) * 8) < 0
                                     )) {
                                    local_c0 = -1;
                                  }
                                  else {
                                    local_c0 = *(REF_GLOB *)
                                                (*(long *)(a_size + 4) +
                                                (long)*(int *)(*(long *)&ref_mpi_local->max_tag +
                                                              (long)(a_next._4_4_ << 1) * 4) * 8);
                                  }
                                  b_nodes[a_edge[(int)a_next] << 1] = local_c0;
                                  if (((*(int *)(*(long *)&ref_mpi_local->max_tag +
                                                (long)(a_next._4_4_ * 2 + 1) * 4) < 0) ||
                                      (a_size[1] <=
                                       *(int *)(*(long *)&ref_mpi_local->max_tag +
                                               (long)(a_next._4_4_ * 2 + 1) * 4))) ||
                                     (*(long *)(*(long *)(a_size + 4) +
                                               (long)*(int *)(*(long *)&ref_mpi_local->max_tag +
                                                             (long)(a_next._4_4_ * 2 + 1) * 4) * 8)
                                      < 0)) {
                                    local_c8 = -1;
                                  }
                                  else {
                                    local_c8 = *(REF_GLOB *)
                                                (*(long *)(a_size + 4) +
                                                (long)*(int *)(*(long *)&ref_mpi_local->max_tag +
                                                              (long)(a_next._4_4_ * 2 + 1) * 4) * 8)
                                    ;
                                  }
                                  b_nodes[a_edge[(int)a_next] * 2 + 1] = local_c8;
                                  a_edge[(int)a_next] = a_edge[(int)a_next] + 1;
                                }
                              }
                              uVar1 = ref_mpi_alltoallv((REF_MPI)data_local,b_nodes,b_size,a_data,
                                                        _b_total,2,2);
                              if (uVar1 == 0) {
                                for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < part;
                                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                  uVar1 = ref_node_local((REF_NODE)a_size,
                                                         a_data[ref_malloc_init_i_1 << 1],&request);
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                           ,0x13f,"ref_edge_ghost_glob",(ulong)uVar1,"loc 0");
                                    return uVar1;
                                  }
                                  uVar1 = ref_node_local((REF_NODE)a_size,
                                                         a_data[ref_malloc_init_i_1 * 2 + 1],
                                                         &ref_malloc_init_i);
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                           ,0x140,"ref_edge_ghost_glob",(ulong)uVar1,"loc 1");
                                    return uVar1;
                                  }
                                  uVar1 = ref_edge_with((REF_EDGE)ref_mpi_local,request,
                                                        ref_malloc_init_i,
                                                        (REF_INT *)((long)&a_next + 4));
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                           ,0x141,"ref_edge_ghost_glob",(ulong)uVar1,"find edge");
                                    return uVar1;
                                  }
                                  *(undefined8 *)((long)_node1 + (long)ref_malloc_init_i_1 * 8) =
                                       *(undefined8 *)(&ref_node->n + (long)a_next._4_4_ * 2);
                                }
                                uVar1 = ref_mpi_alltoallv((REF_MPI)data_local,_node1,_b_total,b_data
                                                          ,b_size,1,2);
                                if (uVar1 == 0) {
                                  for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < edge;
                                      ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                    *(REF_GLOB *)
                                     (&ref_node->n +
                                     (long)*(int *)((long)a_nodes + (long)ref_malloc_init_i_1 * 4) *
                                     2) = b_data[ref_malloc_init_i_1];
                                  }
                                  if (a_edge != (REF_INT *)0x0) {
                                    free(a_edge);
                                  }
                                  if (_node1 != (void *)0x0) {
                                    free(_node1);
                                  }
                                  if (a_data != (REF_GLOB *)0x0) {
                                    free(a_data);
                                  }
                                  if (a_nodes != (REF_GLOB *)0x0) {
                                    free(a_nodes);
                                  }
                                  if (b_data != (REF_GLOB *)0x0) {
                                    free(b_data);
                                  }
                                  if (b_nodes != (REF_GLOB *)0x0) {
                                    free(b_nodes);
                                  }
                                  if (_b_total != (REF_INT *)0x0) {
                                    free(_b_total);
                                  }
                                  if (b_size != (REF_INT *)0x0) {
                                    free(b_size);
                                  }
                                  ref_edge_local._4_4_ = 0;
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                         ,0x147,"ref_edge_ghost_glob",(ulong)uVar1,
                                         "alltoallv return data");
                                  ref_edge_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                                       ,0x13c,"ref_edge_ghost_glob",(ulong)uVar1,
                                       "alltoallv requested nodes");
                                ref_edge_local._4_4_ = uVar1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,0x11c,"ref_edge_ghost_glob",(ulong)uVar1,"alltoall sizes");
              ref_edge_local._4_4_ = uVar1;
            }
          }
        }
      }
    }
  }
  return ref_edge_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_glob(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                       REF_GLOB *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_GLOB *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_GLOB);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}